

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

bool deqp::gles3::Functional::typeContainsMatchingBasicType
               (VarType *type,dataTypePredicate predicate)

{
  StructType *pSVar1;
  bool bVar2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type != TYPE_BASIC) {
    pSVar1 = (type->m_data).structPtr;
    pSVar3 = (pSVar1->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pSVar1->m_members).
                            super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 3) *
        -0x49249249 < 1) {
      bVar2 = false;
    }
    else {
      lVar4 = 0x20;
      lVar5 = 0;
      do {
        bVar2 = typeContainsMatchingBasicType
                          ((VarType *)((long)&(pSVar3->m_name)._M_dataplus._M_p + lVar4),predicate);
        if (bVar2) {
          return bVar2;
        }
        lVar5 = lVar5 + 1;
        pSVar3 = (pSVar1->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x38;
      } while (lVar5 < (int)((ulong)((long)(pSVar1->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3
                                    ) >> 3) * -0x49249249);
    }
    return bVar2;
  }
  bVar2 = (*predicate)((type->m_data).basic.type);
  return bVar2;
}

Assistant:

static bool typeContainsMatchingBasicType (const glu::VarType& type, const dataTypePredicate predicate)
{
	if (type.isBasicType())
		return predicate(type.getBasicType());
	else if (type.isArrayType())
		return typeContainsMatchingBasicType(type.getElementType(), predicate);
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			if (typeContainsMatchingBasicType(structType.getMember(i).getType(), predicate))
				return true;
		return false;
	}
}